

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<long>::MultAdd
          (TPZFMatrix<long> *this,TPZFMatrix<long> *x,TPZFMatrix<long> *y,TPZFMatrix<long> *z,
          long alpha,long beta,int opt)

{
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  char *msg1;
  ulong uVar12;
  ulong col;
  int64_t i;
  ulong row;
  bool bVar13;
  
  lVar9 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
  if (opt == 0) {
    if (((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol != lVar9) ||
       ((bVar13 = beta == 0, !bVar13 &&
        ((msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>",
         (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow !=
         (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow ||
         ((y->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
          (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)))))) goto LAB_00ca494c;
    if ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol ==
        (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
      lVar9 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
      goto LAB_00ca4996;
    }
  }
  else {
    if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow != lVar9) {
LAB_00ca494c:
      Error(msg1,(char *)0x0);
      return;
    }
    if (beta == 0) {
      bVar13 = true;
    }
    else {
      msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
      if (((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
           (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) ||
         ((y->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
          (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) goto LAB_00ca494c;
      bVar13 = false;
    }
    if ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol ==
        (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
      lVar9 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
LAB_00ca4996:
      if ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow == lVar9) goto LAB_00ca49ab;
    }
  }
  (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])(z);
LAB_00ca49ab:
  uVar12 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  if (uVar12 == 0) {
    (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(z);
    uVar12 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  }
  uVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  uVar8 = uVar12;
  if (opt == 0) {
    uVar8 = uVar2;
  }
  uVar6 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  uVar8 = uVar8 & 0xffffffff;
  if (uVar8 != 0) {
    col = 0;
    uVar10 = 0;
    if (0 < (long)uVar6) {
      uVar10 = uVar6;
    }
    for (; col != uVar10; col = col + 1) {
      plVar5 = operator()(z,0,col);
      if (bVar13) {
        for (lVar9 = 0; uVar8 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
          *(undefined8 *)((long)plVar5 + lVar9) = 0;
        }
      }
      else {
        if (z != y) {
          memcpy(plVar5,y->fElem + (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * col,
                 uVar8 * 8);
        }
        for (row = 0; uVar8 != row; row = row + 1) {
          plVar5 = operator()(z,row,col);
          *plVar5 = *plVar5 * beta;
        }
      }
    }
  }
  if (uVar2 * uVar12 != 0) {
    uVar8 = 0;
    if ((long)uVar12 < 1) {
      uVar12 = uVar8;
    }
    if ((long)uVar6 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      if (opt == 0) {
        for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
          plVar7 = operator()(z,0,uVar8);
          plVar5 = plVar7 + uVar2;
          plVar11 = this->fElem + uVar10 * uVar2;
          lVar9 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
          plVar3 = x->fElem;
          for (; plVar7 < plVar5; plVar7 = plVar7 + 1) {
            lVar4 = *plVar11;
            plVar11 = plVar11 + 1;
            *plVar7 = *plVar7 + lVar4 * alpha * plVar3[lVar9 * uVar8 + uVar10];
          }
        }
      }
      else {
        plVar5 = this->fElem;
        plVar7 = operator()(z,0,uVar8);
        plVar3 = x->fElem;
        for (uVar10 = 0; uVar10 != uVar12; uVar10 = uVar10 + 1) {
          plVar11 = plVar3 + (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * uVar8;
          plVar1 = plVar11 + uVar2;
          lVar9 = 0;
          for (; plVar11 < plVar1; plVar11 = plVar11 + 1) {
            lVar4 = *plVar5;
            plVar5 = plVar5 + 1;
            lVar9 = lVar9 + *plVar11 * lVar4;
          }
          *plVar7 = *plVar7 + lVar9 * alpha;
          plVar7 = plVar7 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta,const int opt) const {
    
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && this->Rows() != y.Rows()) || (opt && this->Cols() != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != this->Rows()) {
            z.Redim(this->Rows(),x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != this->Cols()) {
            z.Redim(this->Cols(),x.Cols());
        }
    }
    if(this->Cols() == 0)
    {
        z.Zero();
    }
    unsigned numeq = opt ? this->Cols() : this->Rows();
    int64_t rows = this->Rows();
    int64_t cols = this->Cols();
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if (numeq)
    {
        for (ic = 0; ic < xcols; ic++) {
            TVar *zp = &z(0,ic), *zlast = zp+numeq;
            if(beta != (TVar)0.) {
                const TVar *yp = &y.g(0,ic);
                if(&z != &y) {
                    memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
                }
                for(int64_t i=0; i< numeq; i++) z(i,ic) *= beta;
                
            } else {
                while(zp != zlast) {
                    *zp = 0.;
                    zp ++;
                }
            }
        }
    }
    
    if(!(rows*cols)) return;
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                TVar * fp = fElem +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            TVar * fp = fElem,  *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
}